

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::GraphicsPipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *params;
  Parameters *params_00;
  VkShaderStageFlags in_R8D;
  undefined1 in_R9B;
  allocator<char> local_69;
  Parameters local_68;
  undefined1 local_48 [48];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"vert",&local_69);
  local_48._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_68);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->vertexShader,env,(Parameters *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"frag",&local_69);
  local_48._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_68);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->fragmentShader,env,(Parameters *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)&local_68);
  DescriptorSetLayout::Parameters::single(&local_68,1,0x10,1,in_R8D,(bool)in_R9B);
  PipelineLayout::Parameters::singleDescriptorSet((Parameters *)local_48,&local_68);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,env,(Parameters *)local_48);
  PipelineLayout::Parameters::~Parameters((Parameters *)local_48);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::~vector(&local_68.bindings);
  Dependency<vkt::api::(anonymous_namespace)::RenderPass>::Dependency(&this->renderPass,env,params);
  Dependency<vkt::api::(anonymous_namespace)::PipelineCache>::Dependency
            (&this->pipelineCache,env,params_00);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: vertexShader		(env, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"))
			, fragmentShader	(env, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(
										DescriptorSetLayout::Parameters::single(0u, VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1u, VK_SHADER_STAGE_FRAGMENT_BIT, true)))
			, renderPass		(env, RenderPass::Parameters())
			, pipelineCache		(env, PipelineCache::Parameters())
		{}